

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AStateProvider_A_CheckForReload
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AWeapon *this;
  bool bVar2;
  PClassActor *cls;
  FState *val;
  int iVar3;
  char *pcVar4;
  DObject *this_00;
  DObject *this_01;
  
  if (numparam < 1) {
LAB_003e7a5d:
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      this_01 = (DObject *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (this_01 == (DObject *)0x0) goto LAB_003e7887;
        bVar2 = DObject::IsKindOf(this_01,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e7a6d;
        }
      }
      else {
        if (this_01 != (DObject *)0x0) goto LAB_003e7a54;
LAB_003e7887:
        this_01 = (DObject *)0x0;
      }
      if (numparam == 1) goto LAB_003e7a5d;
      if (param[1].field_0.field_3.Type == '\x03') {
        this_00 = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this_00 == (DObject *)0x0) {
LAB_003e78e1:
            this_00 = (DObject *)0x0;
          }
          else {
            bVar2 = DObject::IsKindOf(this_00,AStateProvider::RegistrationInfo.MyClass);
            if (!bVar2) {
              pcVar4 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
              goto LAB_003e7a6d;
            }
          }
          if (2 < (uint)numparam) {
            if (param[2].field_0.field_3.Type == '\x03') {
              if ((this_01[0xe]._vptr_DObject == (_func_int **)0x0) ||
                 (this_01[0xe]._vptr_DObject[0x1a] == (_func_int *)0x0)) {
                if (numret < 1) {
                  return 0;
                }
                if (ret != (VMReturn *)0x0) {
                  VMReturn::SetPointer(ret,(void *)0x0,0);
                  return 1;
                }
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x1172,
                              "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              if (numparam == 3) {
                pcVar4 = "(paramnum) < numparam";
LAB_003e7a95:
                __assert_fail(pcVar4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x1174,
                              "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              if (param[3].field_0.field_3.Type != '\0') {
                pcVar4 = "param[paramnum].Type == REGT_INT";
                goto LAB_003e7a95;
              }
              if ((uint)numparam < 5) {
                pcVar4 = "(paramnum) < numparam";
LAB_003e7abd:
                __assert_fail(pcVar4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x1175,
                              "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              if (param[4].field_0.field_3.Type != '\0') {
                pcVar4 = "param[paramnum].Type == REGT_INT";
                goto LAB_003e7abd;
              }
              iVar3 = param[3].field_0.i;
              iVar1 = param[4].field_0.i;
              cls = (PClassActor *)DObject::GetClass(this_00);
              val = FStateLabelStorage::GetState(&StateLabels,iVar1,cls,false);
              if (numparam == 5) {
                param = defaultparam->Array;
                if (param[5].field_0.field_3.Type != '\0') {
                  pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e7afb:
                  __assert_fail(pcVar4,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x1176,
                                "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              else if (param[5].field_0.field_3.Type != '\0') {
                pcVar4 = "(param[paramnum]).Type == REGT_INT";
                goto LAB_003e7afb;
              }
              iVar1 = param[5].field_0.i;
              if (0 < numret) {
                VMReturn::SetPointer(ret,(void *)0x0,0);
                numret = 1;
              }
              this = (AWeapon *)this_01[0xe]._vptr_DObject[0x1a];
              if ((iVar1 == 0) || (this->ReloadCounter != 0)) {
                iVar3 = (this->ReloadCounter + 1) % iVar3;
                if (iVar3 == 0) {
                  iVar3 = 0;
                  AWeapon::CheckAmmo(this,0,false,false,-1);
                  goto LAB_003e7a37;
                }
              }
              else {
                iVar3 = 1;
              }
              if (numret != 0) {
                VMReturn::SetPointer(ret,val,0);
              }
LAB_003e7a37:
              if (iVar1 == 0) {
                this->ReloadCounter = iVar3;
              }
              return numret;
            }
            pcVar4 = "param[paramnum].Type == REGT_POINTER";
            goto LAB_003e7a6d;
          }
          goto LAB_003e7a5d;
        }
        if (this_00 == (DObject *)0x0) goto LAB_003e78e1;
      }
    }
LAB_003e7a54:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e7a6d:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x116e,
                "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_CheckForReload)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);

	if ( self->player == NULL || self->player->ReadyWeapon == NULL )
	{
		ACTION_RETURN_STATE(NULL);
	}
	PARAM_INT		(count);
	PARAM_STATE_ACTION	(jump);
	PARAM_BOOL_DEF	(dontincrement);

	if (numret > 0)
	{
		ret->SetPointer(NULL, ATAG_STATE);
		numret = 1;
	}

	AWeapon *weapon = self->player->ReadyWeapon;

	int ReloadCounter = weapon->ReloadCounter;
	if (!dontincrement || ReloadCounter != 0)
		ReloadCounter = (weapon->ReloadCounter+1) % count;
	else // 0 % 1 = 1?  So how do we check if the weapon was never fired?  We should only do this when we're not incrementing the counter though.
		ReloadCounter = 1;

	// If we have not made our last shot...
	if (ReloadCounter != 0)
	{
		// Go back to the refire frames, instead of continuing on to the reload frames.
		if (numret != 0)
		{
			ret->SetPointer(jump, ATAG_STATE);
		}
	}
	else
	{
		// We need to reload. However, don't reload if we're out of ammo.
		weapon->CheckAmmo(false, false);
	}
	if (!dontincrement)
	{
		weapon->ReloadCounter = ReloadCounter;
	}
	return numret;
}